

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.h
# Opt level: O2

void __thiscall CanonicSampler::markov_step(CanonicSampler *this)

{
  FixedDegreeProposer *this_00;
  uint uVar1;
  Network *network;
  Histogram<unsigned_int> *pHVar2;
  ulong uVar3;
  Random *this_01;
  longdouble in_ST0;
  double dVar4;
  GeneratedProposal proposal;
  
  network = (this->super_UniformSampler).network;
  uVar3 = (ulong)network->total_triangles / 3;
  this_00 = &(this->super_UniformSampler).proposer;
  FixedDegreeProposer::generate_proposal(&proposal,this_00,network);
  this_01 = (Random *)(this->super_UniformSampler).network;
  FixedDegreeProposer::propose(this_00,(Network *)this_01,&proposal);
  uVar1 = ((this->super_UniformSampler).network)->total_triangles;
  Random::R((longdouble *)(this->super_UniformSampler).super_Sampler.rng,this_01);
  dVar4 = exp((double)(uVar1 / 3 - (int)uVar3) * this->beta);
  if ((longdouble)dVar4 < in_ST0) {
    FixedDegreeProposer::rollback(this_00,(this->super_UniformSampler).network,&proposal);
  }
  pHVar2 = (this->super_UniformSampler).super_Sampler.histogram;
  (*pHVar2->_vptr_Histogram[3])(pHVar2,uVar3);
  return;
}

Assistant:

void markov_step() {
        unsigned int old_triangles = network.get_triangles();

        GeneratedProposal proposal = proposer.generate_proposal(network);
        proposer.propose(network, proposal);

        unsigned int new_triangles = network.get_triangles();

        bool was_accepted = true;
        // if rejected
        if (rng.R() > exp(beta*(new_triangles - old_triangles))) {
            proposer.rollback(network, proposal);
            was_accepted = false;
        }

        histogram.add(old_triangles);
    }